

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O1

void InstructionSet::M68k::Primitive::
     shift<(InstructionSet::M68k::Operation)82,unsigned_short,CPU::MC68000::ProcessorBase>
               (uint32_t source,unsigned_short *destination,Status *status,
               ProcessorBase *flow_controller)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = source & 0x3f;
  flow_controller->dynamic_instruction_length_ = uVar2 + 1;
  if (uVar2 == 0) {
    status->overflow_flag = 0;
    status->carry_flag = 0;
  }
  else {
    if (uVar2 < 0x11) {
      uVar3 = (ulong)((*destination >> (uVar2 - 1 & 0x1f) & 1) != 0);
      status->extend_flag = uVar3;
      status->carry_flag = uVar3;
    }
    else {
      status->carry_flag = 0;
      status->extend_flag = 0;
    }
    status->overflow_flag = 0;
    uVar1 = 0;
    if (uVar2 < 0x10) {
      uVar1 = *destination >> ((byte)uVar2 & 0x1f);
    }
    *destination = uVar1;
  }
  uVar1 = *destination;
  status->zero_result = (ulong)uVar1;
  status->negative_flag = (ulong)(uVar1 & 0x8000);
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}